

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase233::run(TestCase233 *this)

{
  Reader reader;
  Builder builder;
  PromiseNode *pPVar1;
  long *plVar2;
  Iface *pIVar3;
  CapTableReader *pCVar4;
  byte *pbVar5;
  ReaderOptions options;
  PipeWithSmallBuffer fds;
  Own<capnp::MessageReader> received;
  Own<kj::AsyncInputStream> input;
  FragmentingOutputStream output;
  AsyncIoContext ioContext;
  Thread thread;
  SocketOutputStream rawOutput;
  TestMessageBuilder message;
  PipeWithSmallBuffer local_240;
  Promise<kj::Own<capnp::MessageReader>_> local_238;
  undefined8 *local_228;
  long *local_220;
  Function<void_()> local_218;
  PointerReader local_208;
  ArrayOutputStream local_1e8;
  undefined8 *local_1c8;
  long *local_1c0;
  Reader local_1a8;
  Thread local_188;
  undefined8 in_stack_fffffffffffffea0;
  SegmentBuilder *in_stack_fffffffffffffea8;
  CapTableBuilder *in_stack_fffffffffffffeb0;
  void *in_stack_fffffffffffffeb8;
  WirePointer *in_stack_fffffffffffffec0;
  StructReader local_130;
  TestMessageBuilder local_100;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&local_240);
  kj::setupAsyncIo();
  (*(code *)**(undefined8 **)local_1e8.fillPos)(&local_228,local_1e8.fillPos,local_240.fds[0]);
  kj::FdOutputStream::FdOutputStream((FdOutputStream *)&stack0xfffffffffffffe90,local_240.fds[1]);
  local_1e8.super_BufferedOutputStream.super_OutputStream._vptr_OutputStream =
       (OutputStream)&PTR__ArrayOutputStream_0060d028;
  local_1e8.array.ptr = (uchar *)&stack0xfffffffffffffe90;
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0060d070;
  local_100.desiredSegmentCount = 7;
  MessageBuilder::getRootInternal((Builder *)&local_1a8,(MessageBuilder *)&local_100);
  local_208.pointer = local_1a8.reader.pointer;
  local_208.segment = local_1a8.reader.segment;
  local_208.capTable = local_1a8.reader.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffea8,(PointerBuilder *)&local_208,
             (StructSize)0x140006,(word *)0x0);
  builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffea8;
  builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffea0;
  builder._builder.data = in_stack_fffffffffffffeb0;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffeb8;
  builder._builder._32_8_ = in_stack_fffffffffffffec0;
  initTestMessage(builder);
  local_218.impl.ptr = (Iface *)operator_new(0x18);
  (local_218.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0060d148;
  local_218.impl.ptr[1]._vptr_Iface = (_func_int **)&local_1e8;
  local_218.impl.ptr[2]._vptr_Iface = (_func_int **)&local_100;
  local_218.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase233::run()::$_0>>
        ::instance;
  kj::Thread::Thread(&local_188,&local_218);
  pIVar3 = local_218.impl.ptr;
  if (local_218.impl.ptr != (Iface *)0x0) {
    local_218.impl.ptr = (Iface *)0x0;
    (**(local_218.impl.disposer)->_vptr_Disposer)
              (local_218.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  options._8_8_ = 0x800000;
  options.traversalLimitInWords = (uint64_t)local_220;
  readMessage((AsyncInputStream *)&local_208,options,(ArrayPtr<capnp::word>)ZEXT816(0x40));
  kj::Promise<kj::Own<capnp::MessageReader>_>::wait(&local_238,&local_208);
  pCVar4 = local_208.capTable;
  if (local_208.capTable != (CapTableReader *)0x0) {
    local_208.capTable = (CapTableReader *)0x0;
    (*(code *)(local_208.segment)->arena->_vptr_Arena)
              (local_208.segment,
               (_func_int *)
               ((long)&pCVar4->_vptr_CapTableReader + (long)pCVar4->_vptr_CapTableReader[-2]));
  }
  MessageReader::getRootInternal(&local_1a8,(MessageReader *)local_238.super_PromiseBase.node.ptr);
  local_208.pointer = local_1a8.reader.pointer;
  local_208.nestingLimit = local_1a8.reader.nestingLimit;
  local_208._28_4_ = local_1a8.reader._28_4_;
  local_208.segment = local_1a8.reader.segment;
  local_208.capTable = local_1a8.reader.capTable;
  PointerReader::getStruct(&local_130,&local_208,(word *)0x0);
  reader._reader.capTable = local_130.capTable;
  reader._reader.segment = local_130.segment;
  reader._reader.data = local_130.data;
  reader._reader.pointers = local_130.pointers;
  reader._reader.dataSize = local_130.dataSize;
  reader._reader.pointerCount = local_130.pointerCount;
  reader._reader._38_2_ = local_130._38_2_;
  reader._reader.nestingLimit = local_130.nestingLimit;
  reader._reader._44_4_ = local_130._44_4_;
  checkTestMessage(reader);
  pPVar1 = local_238.super_PromiseBase.node.ptr;
  if ((MessageReader *)local_238.super_PromiseBase.node.ptr != (MessageReader *)0x0) {
    local_238.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_238.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_238.super_PromiseBase.node.disposer,
               (code *)((long)((long)pPVar1 + 0x18) + (long)(pPVar1->_vptr_PromiseNode[-2] + -0x18))
              );
  }
  kj::Thread::~Thread(&local_188);
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  kj::ArrayOutputStream::~ArrayOutputStream(&local_1e8);
  kj::FdOutputStream::~FdOutputStream((FdOutputStream *)&stack0xfffffffffffffe90);
  plVar2 = local_220;
  if (local_220 != (long *)0x0) {
    local_220 = (long *)0x0;
    (**(code **)*local_228)(local_228,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_1c0;
  if (local_1c0 != (long *)0x0) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pbVar5 = local_1e8.fillPos;
  if ((long *)local_1e8.fillPos != (long *)0x0) {
    local_1e8.fillPos = (byte *)0x0;
    (*(code *)**(undefined8 **)local_1e8.array.size_)
              (local_1e8.array.size_,(long)pbVar5 + *(long *)(*(long *)pbVar5 + -0x10));
  }
  PipeWithSmallBuffer::~PipeWithSmallBuffer(&local_240);
  return;
}

Assistant:

TEST(SerializeAsyncTest, ParseAsyncOddSegmentCount) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto input = ioContext.lowLevelProvider->wrapInputFd(fds[0]);
  SocketOutputStream rawOutput(fds[1]);
  FragmentingOutputStream output(rawOutput);

  TestMessageBuilder message(7);
  initTestMessage(message.getRoot<TestAllTypes>());

  kj::Thread thread([&]() {
    writeMessage(output, message);
  });

  auto received = readMessage(*input).wait(ioContext.waitScope);

  checkTestMessage(received->getRoot<TestAllTypes>());
}